

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  size_type *psVar1;
  tm *ptVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 local_250 [8];
  tm time_struct;
  long local_208 [2];
  int local_1f4;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  local_f0 = (ulong *)((long)this / 1000);
  ptVar2 = localtime_r((time_t *)&local_f0,(tm *)local_250);
  if (ptVar2 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_1f4 = time_struct.tm_mday + 0x76c;
  StreamableToString<int>((string *)&time_struct.tm_zone,&local_1f4);
  plVar3 = (long *)std::__cxx11::string::append((char *)&time_struct.tm_zone);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_100 = *puVar5;
    lStack_f8 = plVar3[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar5;
    local_110 = (ulong *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1f0,(String *)(ulong)(time_struct.tm_hour + 1),(int)local_108);
  uVar6 = 0xf;
  if (local_110 != &local_100) {
    uVar6 = local_100;
  }
  if (uVar6 < local_1f0._M_string_length + local_108) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      uVar7 = local_1f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1f0._M_string_length + local_108) goto LAB_0011f04c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0011f04c:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_1f0._M_dataplus._M_p);
  }
  local_70 = &local_60;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_60 = *plVar3;
    uStack_58 = puVar4[3];
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*puVar4;
  }
  local_68 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_40 = *puVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar5;
    local_50 = (ulong *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1d0,(String *)(ulong)(uint)time_struct.tm_min,(int)local_48);
  uVar6 = 0xf;
  if (local_50 != &local_40) {
    uVar6 = local_40;
  }
  if (uVar6 < local_1d0._M_string_length + local_48) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar7 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1d0._M_string_length + local_48) goto LAB_0011f15c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_0011f15c:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_1d0._M_dataplus._M_p);
  }
  local_90 = &local_80;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_80 = *plVar3;
    uStack_78 = puVar4[3];
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*puVar4;
  }
  local_88 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_120 = *puVar5;
    lStack_118 = plVar3[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar5;
    local_130 = (ulong *)*plVar3;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1b0,(String *)(ulong)(uint)time_struct.tm_sec,(int)local_128);
  uVar6 = 0xf;
  if (local_130 != &local_120) {
    uVar6 = local_120;
  }
  if (uVar6 < local_1b0._M_string_length + local_128) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      uVar7 = local_1b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1b0._M_string_length + local_128) goto LAB_0011f286;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0011f286:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_1b0._M_dataplus._M_p);
  }
  local_b0 = &local_a0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_a0 = *plVar3;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = plVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_190,(String *)(ulong)(uint)local_250._4_4_,(int)local_148);
  uVar6 = 0xf;
  if (local_150 != &local_140) {
    uVar6 = local_140;
  }
  if (uVar6 < local_190._M_string_length + local_148) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      uVar7 = local_190.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_190._M_string_length + local_148) goto LAB_0011f3bb;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0011f3bb:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_190._M_dataplus._M_p);
  }
  local_d0 = &local_c0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_c0 = *plVar3;
    uStack_b8 = puVar4[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_e0 = *puVar5;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_170,(String *)(ulong)(uint)local_250._0_4_,(int)local_e8);
  uVar6 = 0xf;
  if (local_f0 != &local_e0) {
    uVar6 = local_e0;
  }
  if (uVar6 < local_170._M_string_length + local_e8) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      uVar7 = local_170.field_2._M_allocated_capacity;
    }
    if (local_170._M_string_length + local_e8 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0011f517;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_170._M_dataplus._M_p);
LAB_0011f517:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((long *)time_struct.tm_zone != local_208) {
    operator_delete(time_struct.tm_zone,local_208[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}